

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebuggerObject.cpp
# Opt level: O2

DynamicObject * __thiscall
JsrtDebuggerObjectFunction::GetJSONObject
          (JsrtDebuggerObjectFunction *this,ScriptContext *scriptContext,bool forceSetValueProp)

{
  ULONG UVar1;
  int iVar2;
  uint uVar3;
  DynamicObject *object;
  FunctionBody *this_00;
  undefined4 extraout_var;
  JavascriptString *jsString;
  
  object = Js::JavascriptLibrary::CreateObject
                     ((scriptContext->super_ScriptContextBase).javascriptLibrary,false,0);
  this_00 = Js::JavascriptFunction::GetFunctionBody(this->javascriptFunction);
  JsrtDebugUtils::AddScriptIdToObject
            (object,(this_00->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)
  ;
  UVar1 = Js::ParseableFunctionInfo::GetLineNumber(&this_00->super_ParseableFunctionInfo);
  JsrtDebugUtils::AddPropertyToObject(object,(JsrtDebugPropertyId)0x10,UVar1,scriptContext);
  UVar1 = Js::ParseableFunctionInfo::GetColumnNumber(&this_00->super_ParseableFunctionInfo);
  JsrtDebugUtils::AddPropertyToObject(object,(JsrtDebugPropertyId)0x3,UVar1,scriptContext);
  iVar2 = (*(this_00->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(this_00);
  uVar3 = (*(this_00->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[8])(this_00);
  JsrtDebugUtils::AddPropertyToObject
            (object,(JsrtDebugPropertyId)0x13,(char16 *)CONCAT44(extraout_var,iVar2),(ulong)uVar3,
             scriptContext);
  jsString = Js::StringCache::GetFunctionTypeDisplay
                       (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache);
  JsrtDebugUtils::AddPropertyToObject(object,(JsrtDebugPropertyId)0x21,jsString,scriptContext);
  JsrtDebugUtils::AddPropertyToObject
            (object,(JsrtDebugPropertyId)0xe,(this->super_JsrtDebuggerObjectBase).handle,
             scriptContext);
  return object;
}

Assistant:

Js::DynamicObject * JsrtDebuggerObjectFunction::GetJSONObject(Js::ScriptContext * scriptContext, bool forceSetValueProp)
{
    Js::DynamicObject* functionObject = scriptContext->GetLibrary()->CreateObject();

    Js::FunctionBody* functionBody  = this->javascriptFunction->GetFunctionBody();
    JsrtDebugUtils::AddScriptIdToObject(functionObject, functionBody->GetUtf8SourceInfo());
    JsrtDebugUtils::AddPropertyToObject(functionObject, JsrtDebugPropertyId::line, (uint32)functionBody->GetLineNumber(), scriptContext);
    JsrtDebugUtils::AddPropertyToObject(functionObject, JsrtDebugPropertyId::column, (uint32)functionBody->GetColumnNumber(), scriptContext);
    JsrtDebugUtils::AddPropertyToObject(functionObject, JsrtDebugPropertyId::name, functionBody->GetDisplayName(), functionBody->GetDisplayNameLength(), scriptContext);
    JsrtDebugUtils::AddPropertyToObject(functionObject, JsrtDebugPropertyId::type, scriptContext->GetLibrary()->GetFunctionTypeDisplayString(), scriptContext);
    JsrtDebugUtils::AddPropertyToObject(functionObject, JsrtDebugPropertyId::handle, this->GetHandle(), scriptContext);

    return functionObject;
}